

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O3

void pgraph_dump_celsius_pipe(int cnum,pgraph_state *state)

{
  uint32_t *puVar1;
  bool bVar2;
  void *pvVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int i_4;
  int iVar10;
  uint32_t (*pauVar11) [16];
  uint32_t (*pauVar12) [4];
  uint32_t (*pauVar13) [3];
  int i;
  long lVar14;
  long lVar15;
  uint32_t uVar16;
  uint32_t word;
  uint32_t vtx [20];
  uint32_t local_90;
  int local_8c;
  uint32_t auStack_88 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar3 = nva_cards[cnum]->bar0;
  *(undefined4 *)((long)pvVar3 + 0x40014c) = 0x56;
  bVar2 = state->celsius_pipe_broke_ovtx;
  if (bVar2 == true) {
    *(undefined4 *)((long)pvVar3 + 0x400f50) = 0x4470;
    lVar14 = 0;
    do {
      state->celsius_pipe_junk[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  pauVar11 = state->celsius_pipe_ovtx;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = (int)lVar14 * 0x40 + 0x800;
    lVar15 = 0;
    do {
      (*pauVar11)[lVar15] = *(uint32_t *)((long)pvVar3 + 0x400f54);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    lVar14 = lVar14 + 1;
    pauVar11 = pauVar11 + 1;
  } while (lVar14 != 0x10);
  *(undefined4 *)((long)pvVar3 + 0x400f50) = 0x4400;
  lVar14 = 0;
  do {
    state->celsius_pipe_vtx[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x1c);
  if (bVar2 == false) {
    *(undefined4 *)((long)pvVar3 + 0x400f50) = 0x4470;
    lVar14 = 0;
    do {
      state->celsius_pipe_junk[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  pauVar11 = state->celsius_pipe_xvtx;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = (int)lVar14 * 0x40 + 0x200;
    lVar15 = 0;
    do {
      (*pauVar11)[lVar15] = *(uint32_t *)((long)pvVar3 + 0x400f54);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    lVar14 = lVar14 + 1;
    pauVar11 = pauVar11 + 1;
  } while (lVar14 != 3);
  pauVar12 = state->celsius_pipe_xfrm;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = (int)lVar14 * 0x10 + 0x6400;
    lVar15 = 0;
    do {
      (*pauVar12)[lVar15] = *(uint32_t *)((long)pvVar3 + 0x400f54);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    lVar14 = lVar14 + 1;
    pauVar12 = pauVar12 + 1;
  } while (lVar14 != 0x3c);
  pauVar13 = state->celsius_pipe_light_v;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = (int)lVar14 * 0x10 + 0x6800;
    lVar15 = 0;
    do {
      (*pauVar13)[lVar15] = *(uint32_t *)((long)pvVar3 + 0x400f54);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar14 = lVar14 + 1;
    pauVar13 = pauVar13 + 1;
  } while (lVar14 != 0x30);
  iVar10 = 0x6c00;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = iVar10;
    state->celsius_pipe_light_sa[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
    lVar14 = lVar14 + 1;
    iVar10 = iVar10 + 0x10;
  } while (lVar14 != 3);
  iVar10 = 0x7000;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = iVar10;
    state->celsius_pipe_light_sb[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
    lVar14 = lVar14 + 1;
    iVar10 = iVar10 + 0x10;
  } while (lVar14 != 0x13);
  iVar10 = 0x7400;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = iVar10;
    state->celsius_pipe_light_sc[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
    lVar14 = lVar14 + 1;
    iVar10 = iVar10 + 0x10;
  } while (lVar14 != 0xc);
  iVar10 = 0x7800;
  lVar14 = 0;
  do {
    *(int *)((long)pvVar3 + 0x400f50) = iVar10;
    state->celsius_pipe_light_sd[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
    lVar14 = lVar14 + 1;
    iVar10 = iVar10 + 0x10;
  } while (lVar14 != 0xc);
  *(undefined4 *)((long)pvVar3 + 0x400f50) = 0;
  lVar14 = 0;
  do {
    auStack_88[lVar14] = *(uint32_t *)((long)pvVar3 + 0x400f54);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x14);
  lVar14 = 0;
  do {
    uVar16 = auStack_88[lVar14 * 2 + 1];
    uVar4 = auStack_88[lVar14 * 2 + 2];
    uVar5 = auStack_88[lVar14 * 2 + 3];
    uVar6 = auStack_88[lVar14 * 2 + 4];
    uVar7 = auStack_88[lVar14 * 2 + 5];
    uVar8 = auStack_88[lVar14 * 2 + 6];
    uVar9 = auStack_88[lVar14 * 2 + 7];
    puVar1 = state->celsius_pipe_vtxbuf_offset + lVar14;
    *puVar1 = auStack_88[lVar14 * 2];
    puVar1[1] = uVar4;
    puVar1[2] = uVar6;
    puVar1[3] = uVar8;
    puVar1 = state->celsius_pipe_vtxbuf_format + lVar14;
    *puVar1 = uVar16;
    puVar1[1] = uVar5;
    puVar1[2] = uVar7;
    puVar1[3] = uVar9;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 8);
  state->celsius_pipe_begin_end = (undefined4)local_48;
  state->celsius_pipe_edge_flag = local_48._4_4_;
  state->celsius_pipe_unk48 = (undefined4)uStack_40;
  state->celsius_pipe_vtx_state = uStack_40._4_4_;
  if ((state->chipset).chipset == 0x10) {
    uVar16 = 0x3c;
    lVar14 = 0;
    local_8c = cnum;
    do {
      local_90 = 0;
      pgraph_load_pipe(cnum,4,&local_90,1);
      pvVar3 = nva_cards[cnum]->bar0;
      *(undefined4 *)((long)pvVar3 + 0x400f50) = 0x4c;
      if (lVar14 + 7U != (ulong)(*(uint *)((long)pvVar3 + 0x400f54) & 0x1f)) {
        *(byte *)(state->celsius_pipe_vtxbuf_format + lVar14 + 7) =
             (byte)state->celsius_pipe_vtxbuf_format[lVar14 + 7] & 0x8f;
      }
      local_90 = 0;
      pgraph_load_pipe(local_8c,uVar16,&local_90,1);
      uVar16 = uVar16 - 8;
      lVar14 = lVar14 + -1;
    } while (lVar14 != -7);
  }
  return;
}

Assistant:

void pgraph_dump_celsius_pipe(int cnum, struct pgraph_state *state) {
	nva_wr32(cnum, 0x40014c, 0x00000056);
	if (state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 0x10; i++)
		pgraph_dump_pipe(cnum, 0x0800 + i * 0x40, state->celsius_pipe_ovtx[i], 0x10);
	pgraph_dump_pipe(cnum, 0x4400, state->celsius_pipe_vtx, 0x1c);
	if (!state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 3; i++)
		pgraph_dump_pipe(cnum, 0x0200 + i * 0x40, state->celsius_pipe_xvtx[i], 0x10);
	for (int i = 0; i < 0x3c; i++) {
		pgraph_dump_pipe(cnum, 0x6400 + i * 0x10, state->celsius_pipe_xfrm[i], 4);
	}
	for (int i = 0; i < 0x30; i++) {
		pgraph_dump_pipe(cnum, 0x6800 + i * 0x10, state->celsius_pipe_light_v[i], 3);
	}
	for (int i = 0; i < 3; i++) {
		pgraph_dump_pipe(cnum, 0x6c00 + i * 0x10, state->celsius_pipe_light_sa + i, 1);
	}
	for (int i = 0; i < 19; i++) {
		pgraph_dump_pipe(cnum, 0x7000 + i * 0x10, state->celsius_pipe_light_sb + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7400 + i * 0x10, state->celsius_pipe_light_sc + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7800 + i * 0x10, state->celsius_pipe_light_sd + i, 1);
	}
	uint32_t vtx[20];
	pgraph_dump_pipe(cnum, 0x0000, vtx, 20);
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = vtx[2*i];
		state->celsius_pipe_vtxbuf_format[i] = vtx[2*i+1];
	}
	state->celsius_pipe_begin_end = vtx[16];
	state->celsius_pipe_edge_flag = vtx[17];
	state->celsius_pipe_unk48 = vtx[18];
	state->celsius_pipe_vtx_state = vtx[19];
	if (state->chipset.chipset == 0x10) {
		// Fuck me with a chainsaw.  On NV10, vtxbuf_format readout is broken in
		// two ways:
		//
		// 1. If component count is 0 (ie. a vtxbuf is disabled), it reads as some
		//    non-zero value depending on the attribute instead.
		// 2. Bit 2 of format of attribute 2 (ie. secondary color) comes from
		//    attribute 1 (primary color) instead.
		//
		// Work around #1 by observing the last active attribute in vtx_state.
		for (unsigned i = 7; i > 0; i--) {
			uint32_t word = 0;
			pgraph_load_pipe(cnum, 4, &word, 1);
			pgraph_dump_pipe(cnum, 0x4c, &word, 1);
			if (extr(word, 0, 5) != i)
				insrt(state->celsius_pipe_vtxbuf_format[i], 4, 3, 0);
			word = 0;
			pgraph_load_pipe(cnum, i*8+4, &word, 1);
		}
	}
}